

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<double,_3,_3> * tcu::operator*(Matrix<double,_3,_2> *a,Matrix<double,_2,_3> *b)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Vector<double,_3> *pVVar5;
  int row_1;
  long lVar6;
  Vector<double,_3> *in_RDI;
  Vector<double,_3> *pVVar7;
  int row;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  bool bVar12;
  undefined8 uVar13;
  long lVar11;
  
  pVVar5 = in_RDI;
  in_RDI[2].m_data[0] = 0;
  *(undefined8 *)((long)(in_RDI + 2) + 8) = 0;
  in_RDI[1].m_data[1] = 0.0;
  in_RDI[1].m_data[2] = 0.0;
  in_RDI->m_data[2] = 0.0;
  in_RDI[1].m_data[0] = 0.0;
  in_RDI->m_data[0] = 0.0;
  in_RDI->m_data[1] = 0.0;
  *(undefined8 *)((long)(in_RDI + 2) + 0x10) = 0;
  auVar4 = _DAT_019f34d0;
  auVar3 = _DAT_019ec5b0;
  lVar6 = 0;
  lVar8 = 0;
  pVVar7 = in_RDI;
  do {
    lVar9 = 0;
    auVar10 = auVar4;
    do {
      bVar12 = SUB164(auVar10 ^ auVar3,4) == -0x80000000 && SUB164(auVar10 ^ auVar3,0) < -0x7ffffffd
      ;
      if (bVar12) {
        uVar13 = 0x3ff0000000000000;
        if (lVar6 != lVar9) {
          uVar13 = 0;
        }
        *(undefined8 *)((long)pVVar7->m_data + lVar9) = uVar13;
      }
      if (bVar12) {
        uVar13 = 0x3ff0000000000000;
        if (lVar6 + -0x18 != lVar9) {
          uVar13 = 0;
        }
        *(undefined8 *)((long)pVVar7[1].m_data + lVar9) = uVar13;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0x60);
    lVar8 = lVar8 + 1;
    lVar6 = lVar6 + 0x18;
    pVVar7 = (Vector<double,_3> *)(pVVar7->m_data + 1);
  } while (lVar8 != 3);
  lVar6 = 0;
  do {
    dVar1 = (a->m_data).m_data[0].m_data[lVar6];
    dVar2 = (a->m_data).m_data[1].m_data[lVar6];
    lVar8 = 8;
    pVVar7 = in_RDI;
    do {
      ((Vector<tcu::Vector<double,_3>,_3> *)pVVar7->m_data)->m_data[0].m_data[0] =
           *(double *)((long)(b->m_data).m_data[0].m_data + lVar8) * dVar2 +
           *(double *)((long)(b->m_data).m_data[0].m_data + lVar8 + -8) * dVar1 + 0.0;
      pVVar7 = pVVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x38);
    lVar6 = lVar6 + 1;
    in_RDI = (Vector<double,_3> *)(in_RDI->m_data + 1);
  } while (lVar6 != 3);
  return (Matrix<double,_3,_3> *)pVVar5;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}